

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

int coda_product_definition_add_product_variable
              (coda_product_definition *product_definition,coda_product_variable *product_variable)

{
  int iVar1;
  coda_product_variable **ppcVar2;
  coda_product_variable **new_product_variable;
  coda_product_variable *product_variable_local;
  coda_product_definition *product_definition_local;
  
  iVar1 = coda_hashtable_add_name(product_definition->hash_data,product_variable->name);
  if (iVar1 == 0) {
    if (product_definition->num_product_variables % 0x10 == 0) {
      ppcVar2 = (coda_product_variable **)
                realloc(product_definition->product_variable,
                        (long)(product_definition->num_product_variables + 0x10) << 3);
      if (ppcVar2 == (coda_product_variable **)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)(product_definition->num_product_variables + 0x10) << 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-definition.c"
                       ,0x1a4);
        return -1;
      }
      product_definition->product_variable = ppcVar2;
    }
    product_definition->num_product_variables = product_definition->num_product_variables + 1;
    product_definition->product_variable[product_definition->num_product_variables + -1] =
         product_variable;
    product_definition_local._4_4_ = 0;
  }
  else {
    coda_set_error(-400,"duplicate product variable %s for product definition %s",
                   product_variable->name,product_definition->name);
    product_definition_local._4_4_ = -1;
  }
  return product_definition_local._4_4_;
}

Assistant:

int coda_product_definition_add_product_variable(coda_product_definition *product_definition,
                                                 coda_product_variable *product_variable)
{
    if (hashtable_add_name(product_definition->hash_data, product_variable->name) != 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "duplicate product variable %s for product definition %s",
                       product_variable->name, product_definition->name);
        return -1;
    }
    if (product_definition->num_product_variables % BLOCK_SIZE == 0)
    {
        coda_product_variable **new_product_variable;

        new_product_variable = realloc(product_definition->product_variable,
                                       (product_definition->num_product_variables + BLOCK_SIZE) *
                                       sizeof(coda_product_variable *));
        if (new_product_variable == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (product_definition->num_product_variables + BLOCK_SIZE) *
                           sizeof(coda_product_variable *), __FILE__, __LINE__);
            return -1;
        }
        product_definition->product_variable = new_product_variable;
    }
    product_definition->num_product_variables++;
    product_definition->product_variable[product_definition->num_product_variables - 1] = product_variable;

    return 0;
}